

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# object_pool.hpp
# Opt level: O2

void __thiscall
boost::object_pool<test_handler_class,_boost::default_user_allocator_new_delete>::~object_pool
          (object_pool<test_handler_class,_boost::default_user_allocator_new_delete> *this)

{
  char *pcVar1;
  char *__ptr;
  size_type sVar2;
  
  __ptr = (this->super_pool<boost::default_user_allocator_new_delete>).list.ptr;
  if (__ptr != (char *)0x0) {
    sVar2 = (this->super_pool<boost::default_user_allocator_new_delete>).list.sz;
    pool<boost::default_user_allocator_new_delete>::alloc_size
              (&this->super_pool<boost::default_user_allocator_new_delete>);
    do {
      pcVar1 = *(char **)(__ptr + (sVar2 - 0x10));
      sVar2 = *(size_type *)(__ptr + (sVar2 - 8));
      default_user_allocator_new_delete::free(__ptr);
      __ptr = pcVar1;
    } while (pcVar1 != (char *)0x0);
    (this->super_pool<boost::default_user_allocator_new_delete>).list.ptr = (char *)0x0;
  }
  pool<boost::default_user_allocator_new_delete>::~pool
            (&this->super_pool<boost::default_user_allocator_new_delete>);
  return;
}

Assistant:

object_pool<T, UserAllocator>::~object_pool()
{
#ifndef BOOST_POOL_VALGRIND
  // handle trivial case of invalid list.
  if (!this->list.valid())
    return;

  details::PODptr<size_type> iter = this->list;
  details::PODptr<size_type> next = iter;

  // Start 'freed_iter' at beginning of free list
  void * freed_iter = this->first;

  const size_type partition_size = this->alloc_size();

  do
  {
    // increment next
    next = next.next();

    // delete all contained objects that aren't freed.

    // Iterate 'i' through all chunks in the memory block.
    for (char * i = iter.begin(); i != iter.end(); i += partition_size)
    {
      // If this chunk is free,
      if (i == freed_iter)
      {
        // Increment freed_iter to point to next in free list.
        freed_iter = nextof(freed_iter);

        // Continue searching chunks in the memory block.
        continue;
      }

      // This chunk is not free (allocated), so call its destructor,
      static_cast<T *>(static_cast<void *>(i))->~T();
      // and continue searching chunks in the memory block.
    }

    // free storage.
    (UserAllocator::free)(iter.begin());

    // increment iter.
    iter = next;
  } while (iter.valid());

  // Make the block list empty so that the inherited destructor doesn't try to
  // free it again.
  this->list.invalidate();
#else
   // destruct all used elements:
   for(std::set<void*>::iterator pos = this->used_list.begin(); pos != this->used_list.end(); ++pos)
   {
      static_cast<T*>(*pos)->~T();
   }
   // base class will actually free the memory...
#endif
}